

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O0

void __thiscall
stringToUnits_specialUnits_Test::~stringToUnits_specialUnits_Test
          (stringToUnits_specialUnits_Test *this)

{
  stringToUnits_specialUnits_Test *this_local;
  
  ~stringToUnits_specialUnits_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, specialUnits)
{
    EXPECT_EQ(
        precise::percent * precise::pu * precise::kg,
        unit_from_string("percentkg"));
    EXPECT_EQ(
        precise::percent * precise::pu * precise::kg,
        unit_from_string("percentkilogram"));
    EXPECT_EQ(
        precise::percent * precise::pu * precise::kg,
        unit_from_string("percentmass"));
    EXPECT_EQ(
        precise::percent * precise::pu * precise::kg, unit_from_string("%kg"));
    EXPECT_EQ(
        precise::percent * precise::pu * precise::kg,
        unit_from_string("%kilogram"));
    EXPECT_EQ(
        precise::percent * precise::pu * precise::kg,
        unit_from_string("%mass"));

    EXPECT_EQ(precise::pu * precise::kg, unit_from_string("perunitkilogram"));
    EXPECT_EQ(precise::pu * precise::kg, unit_from_string("perunitkg"));
    EXPECT_EQ(precise::pu * precise::kg, unit_from_string("pukilogram"));
    EXPECT_EQ(precise::pu * precise::kg, unit_from_string("pukg"));
    EXPECT_EQ(precise::pu * precise::kg, unit_from_string("pumass"));
}